

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

bool __thiscall slang::parsing::Parser::isSequenceRepetition(Parser *this)

{
  TokenKind TVar1;
  Token TVar2;
  
  TVar2 = ParserBase::peek(&this->super_ParserBase,1);
  TVar1 = TVar2.kind;
  if (TVar1 < MinusArrow) {
    if (TVar1 == Star) {
      return true;
    }
    if (TVar1 == Plus) {
      TVar2 = ParserBase::peek(&this->super_ParserBase,2);
      return TVar2.kind == CloseBracket;
    }
  }
  else {
    if (TVar1 == MinusArrow) {
      return true;
    }
    if (TVar1 == Equals) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::isSequenceRepetition() {
    switch (peek(1).kind) {
        case TokenKind::Star:
        case TokenKind::Equals:
        case TokenKind::MinusArrow:
            return true;
        case TokenKind::Plus:
            return peek(2).kind == TokenKind::CloseBracket;
        default:
            return false;
    }
}